

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_array.h
# Opt level: O0

void __thiscall
absl::lts_20240722::
FixedArray<unsigned_long,_18446744073709551615UL,_std::allocator<unsigned_long>_>::~FixedArray
          (FixedArray<unsigned_long,_18446744073709551615UL,_std::allocator<unsigned_long>_> *this)

{
  StorageElement *pSVar1;
  allocator_type *__a;
  unsigned_long *local_18;
  StorageElement *cur;
  FixedArray<unsigned_long,_18446744073709551615UL,_std::allocator<unsigned_long>_> *this_local;
  
  local_18 = Storage::begin(&this->storage_);
  while( true ) {
    pSVar1 = Storage::end(&this->storage_);
    if (local_18 == pSVar1) break;
    __a = Storage::alloc(&this->storage_);
    std::allocator_traits<std::allocator<unsigned_long>_>::destroy<unsigned_long>(__a,local_18);
    local_18 = local_18 + 1;
  }
  Storage::~Storage(&this->storage_);
  return;
}

Assistant:

~FixedArray() noexcept {
    for (auto* cur = storage_.begin(); cur != storage_.end(); ++cur) {
      AllocatorTraits::destroy(storage_.alloc(), cur);
    }
  }